

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::toSdfLayer(Image *__return_storage_ptr__,BVH *_acc,size_t _voxel_resolution,
                        size_t _z_layer,float _refinement)

{
  pointer pTVar1;
  Material *this;
  pointer ptVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined7 extraout_var;
  ulong uVar7;
  undefined8 extraout_RDX;
  int iVar8;
  thread *t_2;
  pointer ptVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  vec3 vVar13;
  long *local_b0;
  undefined4 local_a4;
  Image *local_a0;
  float local_98;
  float local_94;
  thread t;
  vec<3,_float,_(glm::qualifier)0> local_80;
  size_t local_70;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_40;
  
  iVar5 = (int)_voxel_resolution;
  local_a0 = __return_storage_ptr__;
  local_94 = _refinement;
  local_70 = _z_layer;
  iVar4 = std::thread::hardware_concurrency();
  if (_voxel_resolution < (ulong)(long)iVar4) {
    iVar4 = iVar5;
  }
  uVar7 = (ulong)iVar4;
  iVar11 = 0;
  vVar13 = BoundingBox::getDiagonal(&_acc->super_BoundingBox);
  local_80.field_2 = vVar13.field_2;
  local_80._0_8_ = vVar13._0_8_;
  fVar12 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_80);
  Image::Image(local_a0,iVar5,iVar5,4);
  pTVar1 = (_acc->elements).super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_a4 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if ((pTVar1->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(pTVar1->m_colors).
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl + 8)) {
    this = pTVar1->material;
    if (this == (Material *)0x0) {
      local_a4 = 0;
    }
    else {
      std::__cxx11::string::string((string *)&threads,"diffuse",(allocator *)&local_b0);
      bVar3 = Material::haveProperty(this,(string *)&threads);
      local_a4 = (undefined4)CONCAT71(extraout_var,bVar3);
      std::__cxx11::string::~string((string *)&threads);
    }
  }
  local_98 = 1.0 / (float)_voxel_resolution;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = iVar4 + -1;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, iVar4 != iVar11; iVar11 = iVar11 + 1) {
    iVar6 = (int)(_voxel_resolution / uVar7);
    iVar10 = iVar11 * iVar6;
    local_40 = (int)(_voxel_resolution % uVar7);
    iVar8 = 0;
    if (iVar5 == iVar11) {
      iVar8 = local_40;
    }
    iVar8 = iVar8 + iVar6 + iVar10;
    if ((char)local_a4 == '\0') {
      t._M_id._M_thread = (id)0;
      local_b0 = (long *)operator_new(0x48);
      *local_b0 = (long)&PTR___State_003de510;
      local_b0[1] = (long)_acc;
      local_b0[2] = (long)local_a0;
      *(int *)(local_b0 + 3) = iVar10;
      *(int *)((long)local_b0 + 0x1c) = iVar8;
      local_b0[4] = local_70;
      local_b0[5] = _voxel_resolution;
      *(float *)(local_b0 + 6) = local_98;
      *(undefined8 *)((long)local_b0 + 0x34) = local_80._0_8_;
      *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)((long)local_b0 + 0x3c) =
           local_80.field_2;
      *(float *)(local_b0 + 8) = fVar12 * 0.5;
      *(float *)((long)local_b0 + 0x44) = local_94;
      std::thread::_M_start_thread(&t,&local_b0,0);
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>(&threads,&t)
      ;
    }
    else {
      t._M_id._M_thread = (id)0;
      local_b0 = (long *)operator_new(0x48);
      *local_b0 = (long)&PTR___State_003de4d0;
      local_b0[1] = (long)_acc;
      local_b0[2] = (long)local_a0;
      *(int *)(local_b0 + 3) = iVar10;
      *(int *)((long)local_b0 + 0x1c) = iVar8;
      local_b0[4] = local_70;
      local_b0[5] = _voxel_resolution;
      *(float *)(local_b0 + 6) = local_98;
      *(undefined8 *)((long)local_b0 + 0x34) = local_80._0_8_;
      *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)((long)local_b0 + 0x3c) =
           local_80.field_2;
      *(float *)(local_b0 + 8) = fVar12 * 0.5;
      *(float *)((long)local_b0 + 0x44) = local_94;
      std::thread::_M_start_thread(&t,&local_b0,0);
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>(&threads,&t)
      ;
    }
    std::thread::~thread(&t);
  }
  for (; ptVar9 != ptVar2; ptVar9 = ptVar9 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return local_a0;
}

Assistant:

Image toSdfLayer( const BVH* _acc, size_t _voxel_resolution, size_t _z_layer, float _refinement) {
    float voxel_size    = 1.0/float(_voxel_resolution);
    int nThreads  = std::thread::hardware_concurrency();

    if (nThreads > _voxel_resolution)
        nThreads = _voxel_resolution;

    int layersPerThread = _voxel_resolution / nThreads;
    int layersLeftOver  = _voxel_resolution % nThreads;
    glm::vec3 bdiagonal = _acc->getDiagonal();
    float max_dist      = glm::length(bdiagonal) * 0.5f;

    Image layer = Image(_voxel_resolution, _voxel_resolution, 4);

    bool RGBD = _acc->elements[0].haveColors();
    if (!RGBD && _acc->elements[0].material != nullptr)
        if (_acc->elements[0].material->haveProperty("diffuse"))
            RGBD = true;
    // RGBD = false;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_row = i * layersPerThread;
        int end_row = start_row + layersPerThread;
        if (i == nThreads - 1)
            end_row = start_row + layersPerThread + layersLeftOver;


        if (RGBD) {
            std::thread t(
                [_acc, &layer, start_row, end_row, _z_layer, _voxel_resolution, voxel_size, bdiagonal, max_dist, _refinement]() {
                    for (int y = start_row; y < end_row; y++)
                    for (int x = 0; x < _voxel_resolution; x++) {
                        glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                        p = _acc->min + p * bdiagonal;

                        glm::vec4 c = _acc->getClosestRGBSignedDistance(p, max_dist * _refinement);

                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;
                        size_t index = layer.getIndex(x, y);

                        layer.setColor(index, c);
                    }
                }
            );
            threads.push_back(std::move(t));
        }
        else {
            std::thread t(
                [_acc, &layer, start_row, end_row, _z_layer, _voxel_resolution, voxel_size, bdiagonal, max_dist, _refinement]() {
                    for (int y = start_row; y < end_row; y++)
                    for (int x = 0; x < _voxel_resolution; x++) {

                        glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                        p = _acc->min + p * bdiagonal;

                        glm::vec4 c = glm::vec4( 1.0f, 1.0f, 1.0f, _acc->getClosestSignedDistance(p, max_dist * _refinement) );

                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;
                        size_t index = layer.getIndex(x, y);

                        layer.setColor(index, c);
                    }
                }
            );
            threads.push_back(std::move(t));
        }
    }

    for (std::thread& t : threads)
        t.join();

    return layer;
}